

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

response * __thiscall
CppWebSpider::requests::post
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,string *json_data,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data,CookieJar *cookie,int timeout)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar4;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [39];
  undefined1 local_359;
  undefined1 local_358 [64];
  string local_318 [32];
  requests local_2f8 [32];
  string local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [8];
  string sendmsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1e8;
  undefined1 local_1e0;
  __cxx11 local_1d8 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  int local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [4];
  int data_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_110;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_108;
  iterator data_iter;
  int data_count;
  string post_data;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [36];
  int local_3c;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puStack_38;
  int sockfd;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *headers_local;
  string *psStack_28;
  uint16_t port_local;
  string *uri_local;
  string *host_local;
  requests *this_local;
  response *res;
  
  puStack_38 = headers;
  headers_local._6_2_ = port;
  psStack_28 = uri;
  uri_local = host;
  host_local = (string *)this;
  this_local = (requests *)__return_storage_ptr__;
  std::__cxx11::string::string(local_60,(string *)host);
  iVar2 = init(this,(EVP_PKEY_CTX *)local_60);
  local_3c = iVar2;
  std::__cxx11::string::~string(local_60);
  if (iVar2 < 0) {
    std::__cxx11::string::string(local_90,(string *)host);
    std::__cxx11::string::string(local_b0,(string *)uri);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    response::response(__return_storage_ptr__,(string *)local_90,(string *)local_b0,
                       (string *)local_d0,cookie);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&data_count,"",
               (allocator *)
               ((long)&data_iter.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data_iter.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      data_iter.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._0_4_ = 0;
      local_108._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(data);
      while( true ) {
        local_110._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(data);
        bVar1 = std::__detail::operator!=(&local_108,&local_110);
        if (!bVar1) break;
        if (0 < (int)data_iter.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur) {
          std::__cxx11::string::operator+=((string *)&data_count,"&");
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      *)&local_108);
        std::operator+(local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &data_count);
        std::operator+(local_150,(char *)local_170);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      *)&local_108);
        std::operator+(local_130,local_150);
        std::__cxx11::string::operator=((string *)&data_count,(string *)local_130);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)local_170);
        data_iter.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._0_4_ =
             (int)data_iter.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur + 1;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      *)&local_108);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&data_count,(string *)json_data);
    }
    local_174 = std::__cxx11::string::size();
    std::__cxx11::to_string(local_1d8,local_174);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1b8,(char (*) [15])"Content-Length",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    pVar4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(headers,&local_1b8);
    local_1e8._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         ._M_cur;
    local_1e0 = pVar4.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1b8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_const_char_(&)[34],_true>
              (&local_228,(char (*) [13])"Content-Type",
               (char (*) [34])"application/x-www-form-urlencoded");
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(headers,&local_228);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_228);
    std::operator+((char *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"POST ");
    std::operator+(local_2b8,(char *)local_2d8);
    std::operator+(local_298,(char *)local_2b8);
    std::operator+(local_278,local_298);
    std::operator+(local_258,(char *)local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::string(local_318,(string *)local_258);
    std::__cxx11::string::string((string *)(local_358 + 0x20),(string *)host);
    std::__cxx11::string::string((string *)local_358,(string *)uri);
    make_header(local_2f8,(string *)this,(string *)local_318,(string *)(local_358 + 0x20),
                (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_358,(CookieJar *)headers);
    std::__cxx11::string::operator=((string *)local_258,(string *)local_2f8);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)(local_358 + 0x20));
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::operator+=((string *)local_258,(string *)&data_count);
    local_359 = 0;
    std::__cxx11::string::string(local_380,(string *)host);
    std::__cxx11::string::string(local_3a0,(string *)uri);
    iVar2 = local_3c;
    std::__cxx11::string::string(local_3c0,(string *)local_258);
    request_and_recv(__return_storage_ptr__,this,(string *)local_380,(string *)local_3a0,iVar2,
                     (string *)local_3c0,cookie,timeout);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_380);
    close(local_3c);
    local_359 = 1;
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string((string *)&data_count);
  }
  return __return_storage_ptr__;
}

Assistant:

response requests::post(std::string host,std::string uri,uint16_t port,
				std::unordered_map<std::string,std::string> headers,
				std::string json_data,
				std::unordered_map<std::string,std::string> data,
				CookieJar *cookie,
				int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);;

		std::string post_data="";
		if(json_data.size()!=0)
			post_data=json_data;
		else{
			int data_count=0;
			for(auto data_iter=data.begin();data_iter!=data.end();++data_iter){
				if(data_count>0)
					post_data+="&";
				post_data=post_data+data_iter->first+"="+data_iter->second;
				data_count++;
			}
		}

		int data_size=post_data.size();
		headers.insert({"Content-Length",std::to_string(data_size)});
		headers.insert({"Content-Type","application/x-www-form-urlencoded"});

		//base header
		std::string sendmsg=
				"POST "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);
		sendmsg+=post_data;

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}